

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

void __thiscall polyscope::SurfaceMesh::computeDefaultFaceTangentBasisX(SurfaceMesh *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar4;
  uint uVar7;
  uint uVar8;
  pointer pvVar9;
  pointer pvVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  char *__end;
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  string local_68;
  undefined1 local_48 [16];
  
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ensureHostBufferPopulated
            (&this->vertexPositions);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ensureHostBufferPopulated
            (&this->faceNormals);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::resize((this->defaultFaceTangentBasisX).data,
           (*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x430 -
            *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x428 >> 2) - 1)
  ;
  lVar15 = *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x428;
  if (*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x430 - lVar15 != 4) {
    lVar17 = 2;
    uVar18 = 0;
    do {
      if (*(int *)(lVar15 + 4 + uVar18 * 4) - *(int *)(lVar15 + uVar18 * 4) != 3) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,
                   "Default face tangent spaces only available for pure-triangular meshes","");
        exception(&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
      }
      lVar15 = *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x440;
      uVar16 = (ulong)*(uint *)(*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).
                                          field_0x428 + uVar18 * 4);
      uVar7 = *(uint *)(lVar15 + uVar16 * 4);
      uVar8 = *(uint *)(lVar15 + 4 + uVar16 * 4);
      pvVar9 = (((this->vertexPositions).data)->
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar10 = (((this->faceNormals).data)->
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      fVar1 = (&pvVar10->field_0)[lVar17].x;
      fVar13 = pvVar9[uVar8].field_2.z - pvVar9[uVar7].field_2.z;
      uVar2 = pvVar9[uVar7].field_0;
      uVar5 = pvVar9[uVar7].field_1;
      auVar23._4_4_ = uVar5;
      auVar23._0_4_ = uVar2;
      auVar23._8_8_ = 0;
      uVar3 = pvVar9[uVar8].field_0;
      uVar6 = pvVar9[uVar8].field_1;
      auVar24._4_4_ = uVar6;
      auVar24._0_4_ = uVar3;
      auVar24._8_8_ = 0;
      auVar23 = vsubps_avx(auVar24,auVar23);
      uVar16 = *(ulong *)((long)pvVar10 + lVar17 * 4 + -8);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar16;
      fVar11 = (float)uVar16;
      auVar25._0_4_ = auVar23._0_4_ * fVar11;
      fVar12 = (float)(uVar16 >> 0x20);
      auVar25._4_4_ = auVar23._4_4_ * fVar12;
      auVar25._8_4_ = auVar23._8_4_ * 0.0;
      auVar25._12_4_ = auVar23._12_4_ * 0.0;
      auVar19 = vhaddps_avx(auVar25,auVar25);
      fVar20 = auVar19._0_4_ + fVar13 * fVar1;
      auVar26._0_4_ = fVar11 * fVar20;
      auVar26._4_4_ = fVar12 * fVar20;
      auVar26._8_4_ = fVar20 * 0.0;
      auVar26._12_4_ = fVar20 * 0.0;
      auVar23 = vsubps_avx(auVar23,auVar26);
      fVar13 = fVar13 - fVar1 * fVar20;
      auVar19._0_4_ = auVar23._0_4_ * auVar23._0_4_;
      auVar19._4_4_ = auVar23._4_4_ * auVar23._4_4_;
      auVar19._8_4_ = auVar23._8_4_ * auVar23._8_4_;
      auVar19._12_4_ = auVar23._12_4_ * auVar23._12_4_;
      auVar19 = vhaddps_avx(auVar19,auVar19);
      fVar20 = fVar13 * fVar13 + auVar19._0_4_;
      if (fVar20 < 0.0) {
        local_48 = auVar23;
        fVar20 = sqrtf(fVar20);
        auVar23 = local_48;
      }
      else {
        auVar19 = vsqrtss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
        fVar20 = auVar19._0_4_;
      }
      auVar14._8_4_ = 0x80000000;
      auVar14._0_8_ = 0x8000000080000000;
      auVar14._12_4_ = 0x80000000;
      auVar19 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar14);
      fVar20 = 1.0 / fVar20;
      auVar27._0_4_ = fVar20 * auVar23._0_4_;
      auVar27._4_4_ = fVar20 * auVar23._4_4_;
      auVar27._8_4_ = fVar20 * auVar23._8_4_;
      auVar27._12_4_ = fVar20 * auVar23._12_4_;
      fVar20 = fVar20 * fVar13;
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ * auVar19._0_4_)),ZEXT416((uint)fVar20)
                                ,auVar28);
      auVar19 = vpermt2ps_avx512vl(auVar27,_DAT_0034bff0,ZEXT416((uint)fVar20));
      auVar21._0_4_ = auVar19._0_4_ * fVar11;
      auVar21._4_4_ = auVar19._4_4_ * fVar12;
      auVar21._8_4_ = auVar19._8_4_ * 0.0;
      auVar21._12_4_ = auVar19._12_4_ * 0.0;
      auVar19 = vpermt2ps_avx512vl(auVar28,_DAT_0034bff0,ZEXT416((uint)fVar1));
      auVar19 = vfmsub213ps_fma(auVar19,auVar27,auVar21);
      auVar22._0_4_ = auVar19._0_4_ * auVar19._0_4_;
      auVar22._4_4_ = auVar19._4_4_ * auVar19._4_4_;
      auVar22._8_4_ = auVar19._8_4_ * auVar19._8_4_;
      auVar22._12_4_ = auVar19._12_4_ * auVar19._12_4_;
      auVar19 = vmovshdup_avx(auVar22);
      fVar1 = auVar22._0_4_ + auVar19._0_4_ + auVar23._0_4_ * auVar23._0_4_;
      if (fVar1 < 0.0) {
        sqrtf(fVar1);
      }
      uVar18 = uVar18 + 1;
      pvVar9 = (((this->defaultFaceTangentBasisX).data)->
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar4 = vmovlps_avx(auVar27);
      *(undefined8 *)((long)pvVar9 + lVar17 * 4 + -8) = uVar4;
      (&pvVar9->field_0)[lVar17].x = fVar20;
      lVar15 = *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x428;
      lVar17 = lVar17 + 3;
    } while (uVar18 < (*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x430
                       - lVar15 >> 2) - 1U);
  }
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::markHostBufferUpdated
            (&this->defaultFaceTangentBasisX);
  return;
}

Assistant:

void SurfaceMesh::computeDefaultFaceTangentBasisX() {

  // NOTE: this function is weirdly duplicated into an 'X' and 'Y' paradigm to fit the compute-function-per-buffer
  // paradigm

  vertexPositions.ensureHostBufferPopulated();
  faceNormals.ensureHostBufferPopulated();

  defaultFaceTangentBasisX.data.resize(nFaces());

  for (size_t iF = 0; iF < nFaces(); iF++) {
    size_t D = faceIndsStart[iF + 1] - faceIndsStart[iF];
    if (D != 3) exception("Default face tangent spaces only available for pure-triangular meshes");

    size_t start = faceIndsStart[iF];

    glm::vec3 pA = vertexPositions.data[faceIndsEntries[start + 0]];
    glm::vec3 pB = vertexPositions.data[faceIndsEntries[start + 1]];
    glm::vec3 N = faceNormals.data[iF];

    glm::vec3 basisX = pB - pA;
    basisX = glm::normalize(basisX - N * glm::dot(N, basisX));

    glm::vec3 basisY = glm::normalize(-glm::cross(basisX, N));

    defaultFaceTangentBasisX.data[iF] = basisX;
  }

  defaultFaceTangentBasisX.markHostBufferUpdated();
}